

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O0

bool __thiscall Hand::checkSize(Hand *this)

{
  bool local_1a;
  bool local_19;
  Hand *this_local;
  
  if ((this->shouldCheckSize & 1U) == 0) {
    this->ok = true;
  }
  else {
    local_19 = false;
    if (((double)(this->areaLimits).width < this->area) &&
       (local_19 = false, this->area < (double)(this->areaLimits).height)) {
      local_1a = false;
      if ((this->maxAspectRatio != -1) &&
         (local_1a = false, (this->border).height / (this->border).width <= this->maxAspectRatio)) {
        local_1a = (this->border).width / (this->border).height <= this->maxAspectRatio;
      }
      local_19 = local_1a;
    }
    this->ok = local_19;
  }
  return (bool)(this->ok & 1);
}

Assistant:

bool Hand::checkSize() {
    if (shouldCheckSize) {
        ok = (area > areaLimits.width && area < areaLimits.height) &&
             (maxAspectRatio != -1 && border.height / border.width <= maxAspectRatio &&
              border.width / border.height <= maxAspectRatio);
    } else
        ok = true;
    return ok;
}